

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bac.h
# Opt level: O3

void Bac_ManMoveNames(Bac_Man_t *pNew,Bac_Man_t *p)

{
  Vec_Int_t *p_00;
  byte bVar1;
  uint uVar2;
  bool bVar3;
  long lVar4;
  int iVar5;
  int iVar6;
  int *__s;
  ulong uVar7;
  long lVar8;
  long lVar9;
  ulong uVar10;
  ulong uVar11;
  long lVar12;
  Bac_Ntk_t *p_01;
  long lVar13;
  Bac_Ntk_t *p_02;
  ulong local_50;
  
  if (0 < p->nNtks) {
    lVar8 = 1;
    do {
      iVar5 = p->pNtks[lVar8].iCopy;
      if (((long)iVar5 < 1) || (pNew->nNtks < iVar5)) {
        p_01 = (Bac_Ntk_t *)0x0;
      }
      else {
        p_01 = pNew->pNtks + iVar5;
      }
      p_02 = p->pNtks + lVar8;
      if ((p_02->vName).pArray == (int *)0x0) {
        __assert_fail("Bac_NtkHasNames(p)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/bac/bac.h"
                      ,0x255,"void Bac_NtkMoveNames(Bac_Ntk_t *, Bac_Ntk_t *)");
      }
      if ((p_01->vName).pArray != (int *)0x0) {
        __assert_fail("!Bac_NtkHasNames(pNew)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/bac/bac.h"
                      ,0x256,"void Bac_NtkMoveNames(Bac_Ntk_t *, Bac_Ntk_t *)");
      }
      iVar5 = (p_01->vType).nCap;
      lVar9 = (long)iVar5;
      if (lVar9 == 0) {
        __assert_fail("Bac_NtkObjNumAlloc(p)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/bac/bac.h"
                      ,0xfc,"void Bac_NtkStartNames(Bac_Ntk_t *)");
      }
      p_00 = &p_01->vName;
      if ((p_01->vName).nCap < iVar5) {
        __s = (int *)malloc(lVar9 * 4);
        (p_01->vName).pArray = __s;
        if (__s == (int *)0x0) {
          __assert_fail("p->pArray",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                        ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
        }
        p_00->nCap = iVar5;
      }
      else {
        __s = (int *)0x0;
      }
      if (0 < iVar5) {
        memset(__s,0,lVar9 << 2);
      }
      (p_01->vName).nSize = iVar5;
      if (0 < (p_02->vInputs).nSize) {
        lVar9 = 0;
        do {
          iVar5 = (p_02->vInputs).pArray[lVar9];
          if (((long)iVar5 < 0) || ((p_02->vCopy).nSize <= iVar5)) goto LAB_008bee3e;
          uVar2 = (p_02->vCopy).pArray[iVar5];
          iVar5 = Bac_ObjName(p_02,iVar5);
          iVar6 = Bac_ObjName(p_01,uVar2);
          if (iVar6 != 0) goto LAB_008bee5d;
          if (((int)uVar2 < 0) || ((p_01->vType).nSize <= (int)uVar2)) goto LAB_008bee1f;
          if (((p_01->vType).pArray[uVar2] & 0xfcU) == 4) goto LAB_008bee5d;
          Vec_IntFillExtra(p_00,uVar2 + 1,0);
          if ((p_01->vName).nSize <= (int)uVar2) goto LAB_008bee9b;
          (p_01->vName).pArray[uVar2] = iVar5;
          lVar9 = lVar9 + 1;
        } while (lVar9 < (p_02->vInputs).nSize);
      }
      uVar2 = (p_02->vType).nSize;
      uVar7 = (ulong)uVar2;
      if (0 < (int)uVar2) {
        lVar9 = 1;
        lVar12 = 0;
        do {
          if (((p_02->vType).pArray[lVar12] & 0xfeU) == 10) {
            if ((p_02->vCopy).nSize <= lVar12) goto LAB_008bee3e;
            uVar2 = (p_02->vCopy).pArray[lVar12];
            iVar5 = Bac_ObjName(p_02,(int)lVar12);
            iVar6 = Bac_ObjName(p_01,uVar2);
            if (iVar6 != 0) goto LAB_008bee5d;
            if (((int)uVar2 < 0) || ((p_01->vType).nSize <= (int)uVar2)) goto LAB_008bee1f;
            if (((p_01->vType).pArray[uVar2] & 0xfcU) == 4) goto LAB_008bee5d;
            Vec_IntFillExtra(p_00,uVar2 + 1,0);
            if ((p_01->vName).nSize <= (int)uVar2) goto LAB_008bee9b;
            (p_01->vName).pArray[uVar2] = iVar5;
            uVar7 = (ulong)(p_02->vType).nSize;
            if (lVar12 + 1 < (long)uVar7) {
              bVar1 = (p_02->vType).pArray[lVar9];
              lVar13 = lVar9;
              while ((bVar1 & 0xfe) == 8) {
                if ((p_02->vCopy).nSize <= lVar13) goto LAB_008bee3e;
                uVar2 = (p_02->vCopy).pArray[lVar13];
                iVar5 = Bac_ObjName(p_02,(int)lVar13);
                iVar6 = Bac_ObjName(p_01,uVar2);
                if (iVar6 != 0) goto LAB_008bee5d;
                if (((int)uVar2 < 0) || ((p_01->vType).nSize <= (int)uVar2)) goto LAB_008bee1f;
                if (((p_01->vType).pArray[uVar2] & 0xfcU) == 4) goto LAB_008bee5d;
                Vec_IntFillExtra(p_00,uVar2 + 1,0);
                if ((p_01->vName).nSize <= (int)uVar2) goto LAB_008bee9b;
                (p_01->vName).pArray[uVar2] = iVar5;
                uVar2 = (p_02->vType).nSize;
                uVar7 = (ulong)uVar2;
                if ((int)uVar2 <= (int)lVar13 + 1) break;
                lVar4 = lVar13 + 1;
                lVar13 = lVar13 + 1;
                bVar1 = (p_02->vType).pArray[lVar4];
              }
            }
          }
          lVar12 = lVar12 + 1;
          lVar9 = lVar9 + 1;
        } while (lVar12 < (int)uVar7);
        if (0 < (int)uVar7) {
          local_50 = 0xffffffffffffffff;
          lVar9 = 0;
          do {
            if ((lVar9 != 0) && (uVar11 = local_50, ((p_02->vType).pArray[lVar9] & 0xfeU) == 10)) {
              do {
                uVar2 = (p_02->vType).nSize;
                uVar7 = (ulong)uVar2;
                lVar12 = uVar11 + 1;
                iVar5 = (int)lVar12;
                if ((int)uVar2 < iVar5) goto LAB_008bee1f;
                uVar10 = uVar11 & 0xffffffff;
                if (((p_02->vType).pArray[uVar10] & 0xfeU) != 6) goto LAB_008bec88;
                if ((p_02->vCopy).nSize < iVar5) goto LAB_008bee3e;
                iVar6 = (p_02->vCopy).pArray[uVar10];
                lVar13 = (long)iVar6;
                if ((lVar13 < 0) || ((p_01->vType).nSize <= iVar6)) goto LAB_008bee1f;
                if (((p_01->vType).pArray[lVar13] & 0xfcU) != 4) goto LAB_008bee7c;
                if ((p_01->vFanin).nSize <= iVar6) goto LAB_008bee3e;
                iVar6 = Bac_ObjName(p_01,(p_01->vFanin).pArray[lVar13]);
                if (iVar6 == 0) {
                  if ((p_02->vCopy).nSize < iVar5) goto LAB_008bee3e;
                  iVar5 = (p_02->vCopy).pArray[uVar10];
                  lVar13 = (long)iVar5;
                  if ((lVar13 < 0) || ((p_01->vType).nSize <= iVar5)) goto LAB_008bee1f;
                  if (((p_01->vType).pArray[lVar13] & 0xfcU) != 4) goto LAB_008bee7c;
                  if ((p_01->vFanin).nSize <= iVar5) goto LAB_008bee3e;
                  uVar2 = (p_01->vFanin).pArray[lVar13];
                  iVar5 = Bac_ObjName(p_02,(int)uVar11);
                  iVar6 = Bac_ObjName(p_01,uVar2);
                  if (iVar6 != 0) goto LAB_008bee5d;
                  if (((int)uVar2 < 0) || ((p_01->vType).nSize <= (int)uVar2)) goto LAB_008bee1f;
                  if (((p_01->vType).pArray[uVar2] & 0xfcU) == 4) goto LAB_008bee5d;
                  Vec_IntFillExtra(p_00,uVar2 + 1,0);
                  if ((p_01->vName).nSize <= (int)uVar2) goto LAB_008bee9b;
                  (p_01->vName).pArray[uVar2] = iVar5;
                }
                uVar11 = uVar11 - 1;
              } while (1 < lVar12);
              uVar7 = (ulong)(uint)(p_02->vType).nSize;
            }
LAB_008bec88:
            lVar9 = lVar9 + 1;
            local_50 = local_50 + 1;
          } while (lVar9 < (int)uVar7);
        }
      }
      if (0 < (p_02->vOutputs).nSize) {
        lVar9 = 0;
        do {
          iVar5 = (p_02->vOutputs).pArray[lVar9];
          lVar12 = (long)iVar5;
          if ((lVar12 < 0) || ((p_02->vCopy).nSize <= iVar5)) goto LAB_008bee3e;
          iVar6 = (p_02->vCopy).pArray[lVar12];
          lVar13 = (long)iVar6;
          if ((lVar13 < 0) || ((p_01->vType).nSize <= iVar6)) goto LAB_008bee1f;
          if (((p_01->vType).pArray[lVar13] & 0xfcU) != 4) goto LAB_008bee7c;
          if ((p_01->vFanin).nSize <= iVar6) goto LAB_008bee3e;
          iVar6 = Bac_ObjName(p_01,(p_01->vFanin).pArray[lVar13]);
          if (iVar6 == 0) {
            if ((p_02->vCopy).nSize <= iVar5) {
LAB_008bee3e:
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                            ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
            }
            iVar6 = (p_02->vCopy).pArray[lVar12];
            lVar12 = (long)iVar6;
            if ((lVar12 < 0) || ((p_01->vType).nSize <= iVar6)) {
LAB_008bee1f:
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecStr.h"
                            ,0x164,"char Vec_StrEntry(Vec_Str_t *, int)");
            }
            if (((p_01->vType).pArray[lVar12] & 0xfcU) != 4) {
LAB_008bee7c:
              __assert_fail("Bac_ObjIsCo(p, i)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/bac/bac.h"
                            ,0x11d,"int Bac_ObjFanin(Bac_Ntk_t *, int)");
            }
            if ((p_01->vFanin).nSize <= iVar6) goto LAB_008bee3e;
            uVar2 = (p_01->vFanin).pArray[lVar12];
            iVar5 = Bac_ObjName(p_02,iVar5);
            iVar6 = Bac_ObjName(p_01,uVar2);
            if (iVar6 != 0) {
LAB_008bee5d:
              __assert_fail("Bac_ObjName(p, i) == 0 && !Bac_ObjIsCo(p, i)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/bac/bac.h"
                            ,300,"void Bac_ObjSetName(Bac_Ntk_t *, int, int)");
            }
            if (((int)uVar2 < 0) || ((p_01->vType).nSize <= (int)uVar2)) goto LAB_008bee1f;
            if (((p_01->vType).pArray[uVar2] & 0xfcU) == 4) goto LAB_008bee5d;
            Vec_IntFillExtra(p_00,uVar2 + 1,0);
            if ((p_01->vName).nSize <= (int)uVar2) {
LAB_008bee9b:
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                            ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
            }
            (p_01->vName).pArray[uVar2] = iVar5;
          }
          lVar9 = lVar9 + 1;
        } while (lVar9 < (p_02->vOutputs).nSize);
      }
      bVar3 = lVar8 < p->nNtks;
      lVar8 = lVar8 + 1;
    } while (bVar3);
  }
  return;
}

Assistant:

static inline void Bac_ManMoveNames( Bac_Man_t * pNew, Bac_Man_t * p )
{
    Bac_Ntk_t * pNtk; int i;
    Bac_ManForEachNtk( p, pNtk, i )
        Bac_NtkMoveNames( Bac_NtkCopyNtk(pNew, pNtk), pNtk );
}